

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O2

void __thiscall RTIMU::RTIMU(RTIMU *this,RTIMUSettings *settings)

{
  long lVar1;
  RTFusionKalman4 *this_00;
  
  this->_vptr_RTIMU = (_func_int **)&PTR__RTIMU_001285d8;
  RTIMU_DATA::RTIMU_DATA(&this->m_imuData);
  RTVector3::RTVector3(&this->m_previousAccel);
  RTVector3::RTVector3(&this->m_compassAverage);
  this->m_settings = settings;
  this->m_compassCalibrationMode = false;
  this->m_accelCalibrationMode = false;
  this->m_runtimeMagCalValid = false;
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->m_runtimeMagCalMin + lVar1) = 0xc47a0000;
    *(undefined4 *)((long)this[1].m_imuData.fusionPose.m_data + lVar1 + -0x1c) = 0x447a0000;
  }
  if (settings->m_fusionType == 1) {
    this_00 = (RTFusionKalman4 *)operator_new(0x2e8);
    RTFusionKalman4::RTFusionKalman4(this_00);
  }
  else if (settings->m_fusionType == 2) {
    this_00 = (RTFusionKalman4 *)operator_new(0xf0);
    RTFusionRTQF::RTFusionRTQF((RTFusionRTQF *)this_00);
  }
  else {
    this_00 = (RTFusionKalman4 *)operator_new(0xb8);
    RTFusion::RTFusion((RTFusion *)this_00);
  }
  this->m_fusion = &this_00->super_RTFusion;
  printf("Using fusion algorithm %s\n",RTFusion::m_fusionNameMap[this->m_settings->m_fusionType]);
  fflush(_stdout);
  return;
}

Assistant:

RTIMU::RTIMU(RTIMUSettings *settings)
{
    m_settings = settings;

    m_compassCalibrationMode = false;
    m_accelCalibrationMode = false;

    m_runtimeMagCalValid = false;

    for (int i = 0; i < 3; i++) {
        m_runtimeMagCalMax[i] = -1000;
        m_runtimeMagCalMin[i] = 1000;
    }

    switch (m_settings->m_fusionType) {
    case RTFUSION_TYPE_KALMANSTATE4:
        m_fusion = new RTFusionKalman4();
        break;

    case RTFUSION_TYPE_RTQF:
        m_fusion = new RTFusionRTQF();
        break;

    default:
        m_fusion = new RTFusion();
        break;
    }
    HAL_INFO1("Using fusion algorithm %s\n", RTFusion::fusionName(m_settings->m_fusionType));
}